

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ForeachLoopListSyntax::setChild
          (ForeachLoopListSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00a37fb0 + *(int *)(&DAT_00a37fb0 + index * 4)))();
  return;
}

Assistant:

void ForeachLoopListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: arrayName = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 2: openBracket = child.token(); return;
        case 3: loopVariables = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 4: closeBracket = child.token(); return;
        case 5: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}